

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_ecc.c
# Opt level: O0

void apply_z(tc_uECC_word_t *X1,tc_uECC_word_t *Y1,tc_uECC_word_t *Z,tc_uECC_Curve curve)

{
  tc_uECC_word_t local_48 [2];
  tc_uECC_word_t t1 [8];
  tc_uECC_Curve curve_local;
  tc_uECC_word_t *Z_local;
  tc_uECC_word_t *Y1_local;
  tc_uECC_word_t *X1_local;
  
  t1._24_8_ = curve;
  tc_uECC_vli_modSquare_fast(local_48,Z,curve);
  tc_uECC_vli_modMult_fast(X1,X1,local_48,(tc_uECC_Curve)t1._24_8_);
  tc_uECC_vli_modMult_fast(local_48,local_48,Z,(tc_uECC_Curve)t1._24_8_);
  tc_uECC_vli_modMult_fast(Y1,Y1,local_48,(tc_uECC_Curve)t1._24_8_);
  return;
}

Assistant:

void apply_z(tc_uECC_word_t * X1, tc_uECC_word_t * Y1, const tc_uECC_word_t * const Z,
	     tc_uECC_Curve curve)
{
	tc_uECC_word_t t1[NUM_ECC_WORDS];

	tc_uECC_vli_modSquare_fast(t1, Z, curve);    /* z^2 */
	tc_uECC_vli_modMult_fast(X1, X1, t1, curve); /* x1 * z^2 */
	tc_uECC_vli_modMult_fast(t1, t1, Z, curve);  /* z^3 */
	tc_uECC_vli_modMult_fast(Y1, Y1, t1, curve); /* y1 * z^3 */
}